

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::configure_all(Dialog *this)

{
  bool bVar1;
  reference ppWVar2;
  list<Widget_*,_std::allocator<Widget_*>_> *in_RDI;
  iterator it;
  int ysize;
  int xsize;
  _Self local_20;
  _Self local_18;
  int local_10;
  int local_c;
  
  local_c = al_get_display_width
                      ((in_RDI->super__List_base<Widget_*,_std::allocator<Widget_*>_>)._M_impl.
                       _M_node.super__List_node_base._M_prev);
  local_c = local_c / *(int *)&in_RDI[1].super__List_base<Widget_*,_std::allocator<Widget_*>_>.
                               _M_impl._M_node.super__List_node_base._M_next;
  local_10 = al_get_display_height
                       ((in_RDI->super__List_base<Widget_*,_std::allocator<Widget_*>_>)._M_impl.
                        _M_node.super__List_node_base._M_prev);
  local_10 = local_10 /
             *(int *)((long)&in_RDI[1].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl
                             ._M_node.super__List_node_base._M_next + 4);
  local_18._M_node =
       (_List_node_base *)std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::begin(in_RDI);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::end(in_RDI);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppWVar2 = std::_List_iterator<Widget_*>::operator*((_List_iterator<Widget_*> *)0x10ac11);
    Widget::configure(*ppWVar2,local_c,local_10,
                      *(int *)&in_RDI[1].super__List_base<Widget_*,_std::allocator<Widget_*>_>.
                               _M_impl._M_node.super__List_node_base._M_prev,
                      *(int *)((long)&in_RDI[1].
                                      super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                                      _M_node.super__List_node_base._M_prev + 4));
    std::_List_iterator<Widget_*>::operator++(&local_18);
  }
  return;
}

Assistant:

void Dialog::configure_all()
{
   const int xsize = al_get_display_width(display) / this->grid_m;
   const int ysize = al_get_display_height(display) / this->grid_n;

   for (std::list<Widget*>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      (*it)->configure(xsize, ysize, this->x_padding, this->y_padding);
   }
}